

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::JumpToCacheEntry(cmCursesMainForm *this,char *astr)

{
  FORM *form;
  bool bVar1;
  undefined8 __s;
  _Bool _Var2;
  int iVar3;
  ulong uVar4;
  FIELD *pFVar5;
  reference ppfVar6;
  char *__s_00;
  long lVar7;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  string cfld;
  char *curField;
  cmCursesWidget *lbl;
  int findex;
  int start_index;
  FIELD *cur;
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38 [8];
  string str;
  char *astr_local;
  cmCursesMainForm *this_local;
  
  str.field_2._8_8_ = astr;
  std::__cxx11::string::string(local_38);
  __s = str.field_2._8_8_;
  if (str.field_2._8_8_ != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,(char *)__s,&local_79);
    cmsys::SystemTools::LowerCase(&local_58,&local_78);
    std::__cxx11::string::operator=(local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pFVar5 = current_field((this->super_cmCursesForm).Form);
    iVar3 = field_index(pFVar5);
    lbl._0_4_ = iVar3;
    do {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        curField = (char *)0x0;
        if (-1 < (int)lbl) {
          ppfVar6 = std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::operator[]
                              (&this->Fields,(long)((int)lbl + -2));
          curField = (char *)field_userptr(*ppfVar6);
        }
        if ((curField != (char *)0x0) &&
           (__s_00 = (char *)(**(code **)(*(long *)curField + 0x28))(), cfld.field_2._8_8_ = __s_00,
           __s_00 != (char *)0x0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,__s_00,&local_f1);
          cmsys::SystemTools::LowerCase((string *)local_d0,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::allocator<char>::~allocator(&local_f1);
          lVar7 = std::__cxx11::string::find((string *)local_d0,(ulong)local_38);
          if ((lVar7 == -1) || ((int)lbl == iVar3)) {
            bVar1 = false;
          }
          else {
            bVar1 = true;
          }
          std::__cxx11::string::~string((string *)local_d0);
          if (bVar1) break;
        }
      }
      if ((ulong)(long)(int)lbl < this->NumberOfVisibleEntries * 3 - 1) {
        ppfVar6 = std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::operator[]
                            (&this->Fields,(long)((int)lbl + 1));
        _Var2 = new_page(*ppfVar6);
        if (_Var2) {
          form_driver((this->super_cmCursesForm).Form,0x200);
        }
        else {
          form_driver((this->super_cmCursesForm).Form,0x204);
        }
      }
      else {
        form = (this->super_cmCursesForm).Form;
        ppfVar6 = std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::operator[]
                            (&this->Fields,2);
        set_current_field(form,*ppfVar6);
      }
      pFVar5 = current_field((this->super_cmCursesForm).Form);
      lbl._0_4_ = field_index(pFVar5);
    } while ((int)lbl != iVar3);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmCursesMainForm::JumpToCacheEntry(const char* astr)
{
  std::string str;
  if (astr) {
    str = cmSystemTools::LowerCase(astr);
  }

  if (str.empty()) {
    return;
  }
  FIELD* cur = current_field(this->Form);
  int start_index = field_index(cur);
  int findex = start_index;
  for (;;) {
    if (!str.empty()) {
      cmCursesWidget* lbl = nullptr;
      if (findex >= 0) {
        lbl = reinterpret_cast<cmCursesWidget*>(
          field_userptr(this->Fields[findex - 2]));
      }
      if (lbl) {
        const char* curField = lbl->GetValue();
        if (curField) {
          std::string cfld = cmSystemTools::LowerCase(curField);
          if (cfld.find(str) != std::string::npos && findex != start_index) {
            break;
          }
        }
      }
    }
    if (static_cast<size_t>(findex) >= 3 * this->NumberOfVisibleEntries - 1) {
      set_current_field(this->Form, this->Fields[2]);
    } else if (new_page(this->Fields[findex + 1])) {
      form_driver(this->Form, REQ_NEXT_PAGE);
    } else {
      form_driver(this->Form, REQ_NEXT_FIELD);
    }
    cur = current_field(this->Form);
    findex = field_index(cur);
    if (findex == start_index) {
      break;
    }
  }
}